

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void get_text_data_bss(GlobalVars *gv,LinkedSection **sections)

{
  long *in_RSI;
  long in_RDI;
  LinkedSection *ls;
  long *local_18;
  
  in_RSI[2] = 0;
  in_RSI[1] = 0;
  *in_RSI = 0;
  for (local_18 = *(long **)(in_RDI + 0x1d8); *local_18 != 0; local_18 = (long *)*local_18) {
    if ((*(byte *)((long)local_18 + 0x21) & 1) != 0) {
      switch((char)local_18[4]) {
      case '\0':
        *(byte *)((long)local_18 + 0x21) = *(byte *)((long)local_18 + 0x21) & 0xfe;
        break;
      case '\x01':
        if (*in_RSI == 0) {
          *in_RSI = (long)local_18;
        }
        else {
          ierror("%sMultiple code sections (%s)",get_text_data_bss::fn,local_18[3]);
        }
        break;
      case '\x02':
        if (in_RSI[1] == 0) {
          in_RSI[1] = (long)local_18;
        }
        else {
          ierror("%sMultiple data sections (%s)",get_text_data_bss::fn,local_18[3]);
        }
        break;
      case '\x03':
        if (in_RSI[2] == 0) {
          in_RSI[2] = (long)local_18;
        }
        else {
          ierror("%sMultiple bss sections (%s)",get_text_data_bss::fn,local_18[3]);
        }
        break;
      default:
        ierror("%sIllegal section type %d (%s)",get_text_data_bss::fn,(ulong)*(byte *)(local_18 + 4)
               ,local_18[3]);
      }
    }
  }
  return;
}

Assistant:

void get_text_data_bss(struct GlobalVars *gv,struct LinkedSection **sections)
/* find exactly one ST_CODE, ST_DATA and ST_UDATA section, which
   will become .text, .data and .bss */
{
  static const char *fn = "get_text_data_bss(): ";
  struct LinkedSection *ls;

  sections[0] = sections[1] = sections[2] = NULL;
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      switch (ls->type) {
        case ST_UNDEFINED:
          /* @@@ discard undefined sections - they are empty anyway */
          ls->flags &= ~SF_ALLOC;
          break;
        case ST_CODE:
          if (sections[0]==NULL)
            sections[0] = ls;
          else
            ierror("%sMultiple code sections (%s)",fn,ls->name);
          break;
        case ST_DATA:
          if (sections[1]==NULL)
            sections[1] = ls;
          else
            ierror("%sMultiple data sections (%s)",fn,ls->name);
          break;
        case ST_UDATA:
          if (sections[2]==NULL)
            sections[2] = ls;
          else
            ierror("%sMultiple bss sections (%s)",fn,ls->name);
          break;
        default:
          ierror("%sIllegal section type %d (%s)",fn,(int)ls->type,ls->name);
          break;
      }
    }
  }
}